

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_addrnotavail_1(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *loop;
  sockaddr_in addr;
  uv_tcp_t server;
  sockaddr_in sStack_a08;
  uv_buf_t uStack_9f8;
  undefined1 auStack_9e8 [328];
  undefined1 auStack_8a0 [192];
  void *pvStack_7e0;
  uv_tcp_t uStack_7d0;
  uv_loop_t *puStack_6d8;
  sockaddr_in sStack_6c8;
  uv_tcp_t uStack_6b8;
  uv_loop_t *puStack_5c0;
  sockaddr_in sStack_5b0;
  uv_tcp_t uStack_5a0;
  uv_loop_t *puStack_4a8;
  sockaddr_in sStack_498;
  sockaddr_in sStack_488;
  uv_tcp_t uStack_478;
  uv_loop_t *puStack_380;
  sockaddr sStack_378;
  char acStack_368 [56];
  uv_tcp_t uStack_330;
  uv_loop_t *puStack_238;
  sockaddr_in sStack_228;
  uv_tcp_t uStack_218;
  uv_loop_t *puStack_120;
  sockaddr_in local_110;
  uv_tcp_t local_100;
  
  puStack_120 = (uv_loop_t *)0x17ace9;
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,&local_110);
  if (iVar1 == 0) {
    puStack_120 = (uv_loop_t *)0x17acf6;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x17ad03;
    iVar1 = uv_tcp_init(puVar2,&local_100);
    if (iVar1 != 0) goto LAB_0017ad9b;
    puStack_120 = (uv_loop_t *)0x17ad1c;
    iVar1 = uv_tcp_bind(&local_100,(sockaddr *)&local_110,0);
    if ((iVar1 == -99) || (iVar1 == 0)) {
      puStack_120 = (uv_loop_t *)0x17ad3a;
      uv_close((uv_handle_t *)&local_100,close_cb);
      puStack_120 = (uv_loop_t *)0x17ad3f;
      puVar2 = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ad49;
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (close_cb_called != 1) goto LAB_0017ada0;
      puStack_120 = (uv_loop_t *)0x17ad57;
      unaff_RBX = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ad6b;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_120 = (uv_loop_t *)0x17ad75;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      puStack_120 = (uv_loop_t *)0x17ad7a;
      puVar2 = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ad82;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        puStack_120 = (uv_loop_t *)0x17ad8b;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017ada5;
    }
  }
  else {
    puStack_120 = (uv_loop_t *)0x17ad9b;
    run_test_tcp_bind_error_addrnotavail_1_cold_1();
LAB_0017ad9b:
    puStack_120 = (uv_loop_t *)0x17ada0;
    run_test_tcp_bind_error_addrnotavail_1_cold_2();
LAB_0017ada0:
    puStack_120 = (uv_loop_t *)0x17ada5;
    run_test_tcp_bind_error_addrnotavail_1_cold_3();
LAB_0017ada5:
    puStack_120 = (uv_loop_t *)0x17adaa;
    run_test_tcp_bind_error_addrnotavail_1_cold_4();
  }
  puStack_120 = (uv_loop_t *)run_test_tcp_bind_error_addrnotavail_2;
  run_test_tcp_bind_error_addrnotavail_1_cold_5();
  puStack_238 = (uv_loop_t *)0x17adcd;
  puStack_120 = unaff_RBX;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,&sStack_228);
  if (iVar1 == 0) {
    puStack_238 = (uv_loop_t *)0x17adda;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ade7;
    iVar1 = uv_tcp_init(puVar2,&uStack_218);
    if (iVar1 != 0) goto LAB_0017ae77;
    puStack_238 = (uv_loop_t *)0x17ae00;
    iVar1 = uv_tcp_bind(&uStack_218,(sockaddr *)&sStack_228,0);
    if (iVar1 != -99) goto LAB_0017ae7c;
    puStack_238 = (uv_loop_t *)0x17ae16;
    uv_close((uv_handle_t *)&uStack_218,close_cb);
    puStack_238 = (uv_loop_t *)0x17ae1b;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ae25;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017ae81;
    puStack_238 = (uv_loop_t *)0x17ae33;
    unaff_RBX = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ae47;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_238 = (uv_loop_t *)0x17ae51;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_238 = (uv_loop_t *)0x17ae56;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ae5e;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_238 = (uv_loop_t *)0x17ae67;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_238 = (uv_loop_t *)0x17ae77;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_0017ae77:
    puStack_238 = (uv_loop_t *)0x17ae7c;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_0017ae7c:
    puStack_238 = (uv_loop_t *)0x17ae81;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_0017ae81:
    puStack_238 = (uv_loop_t *)0x17ae86;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  puStack_238 = (uv_loop_t *)run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_368 + 0x20,"h blah blah",0xc);
  builtin_strncpy(acStack_368 + 0x10,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_368,"lah blah blah bl",0x10);
  sStack_378._0_8_ = 0x616c622068616c62;
  builtin_strncpy(sStack_378.sa_data + 6,"h blah b",8);
  puStack_380 = (uv_loop_t *)0x17aec7;
  puStack_238 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_380 = (uv_loop_t *)0x17aed4;
  iVar1 = uv_tcp_init(puVar2,&uStack_330);
  if (iVar1 == 0) {
    puStack_380 = (uv_loop_t *)0x17aeeb;
    iVar1 = uv_tcp_bind(&uStack_330,&sStack_378,0);
    if (iVar1 != -0x16) goto LAB_0017af62;
    puStack_380 = (uv_loop_t *)0x17af01;
    uv_close((uv_handle_t *)&uStack_330,close_cb);
    puStack_380 = (uv_loop_t *)0x17af06;
    puVar2 = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17af10;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017af67;
    puStack_380 = (uv_loop_t *)0x17af1e;
    unaff_RBX = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17af32;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_380 = (uv_loop_t *)0x17af3c;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_380 = (uv_loop_t *)0x17af41;
    puVar2 = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17af49;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_380 = (uv_loop_t *)0x17af52;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_380 = (uv_loop_t *)0x17af62;
    run_test_tcp_bind_error_fault_cold_1();
LAB_0017af62:
    puStack_380 = (uv_loop_t *)0x17af67;
    run_test_tcp_bind_error_fault_cold_2();
LAB_0017af67:
    puStack_380 = (uv_loop_t *)0x17af6c;
    run_test_tcp_bind_error_fault_cold_3();
  }
  puStack_380 = (uv_loop_t *)run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  puStack_4a8 = (uv_loop_t *)0x17af8f;
  puStack_380 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_488);
  if (iVar1 == 0) {
    puStack_4a8 = (uv_loop_t *)0x17afad;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&sStack_498);
    if (iVar1 != 0) goto LAB_0017b074;
    puStack_4a8 = (uv_loop_t *)0x17afba;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17afc7;
    iVar1 = uv_tcp_init(puVar2,&uStack_478);
    if (iVar1 != 0) goto LAB_0017b079;
    puStack_4a8 = (uv_loop_t *)0x17afe0;
    iVar1 = uv_tcp_bind(&uStack_478,(sockaddr *)&sStack_488,0);
    if (iVar1 != 0) goto LAB_0017b07e;
    puStack_4a8 = (uv_loop_t *)0x17aff9;
    iVar1 = uv_tcp_bind(&uStack_478,(sockaddr *)&sStack_498,0);
    if (iVar1 != -0x16) goto LAB_0017b083;
    puStack_4a8 = (uv_loop_t *)0x17b013;
    uv_close((uv_handle_t *)&uStack_478,close_cb);
    puStack_4a8 = (uv_loop_t *)0x17b018;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17b022;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017b088;
    puStack_4a8 = (uv_loop_t *)0x17b030;
    unaff_RBX = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17b044;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_4a8 = (uv_loop_t *)0x17b04e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_4a8 = (uv_loop_t *)0x17b053;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17b05b;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_4a8 = (uv_loop_t *)0x17b064;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_4a8 = (uv_loop_t *)0x17b074;
    run_test_tcp_bind_error_inval_cold_1();
LAB_0017b074:
    puStack_4a8 = (uv_loop_t *)0x17b079;
    run_test_tcp_bind_error_inval_cold_2();
LAB_0017b079:
    puStack_4a8 = (uv_loop_t *)0x17b07e;
    run_test_tcp_bind_error_inval_cold_3();
LAB_0017b07e:
    puStack_4a8 = (uv_loop_t *)0x17b083;
    run_test_tcp_bind_error_inval_cold_4();
LAB_0017b083:
    puStack_4a8 = (uv_loop_t *)0x17b088;
    run_test_tcp_bind_error_inval_cold_5();
LAB_0017b088:
    puStack_4a8 = (uv_loop_t *)0x17b08d;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_4a8 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_5c0 = (uv_loop_t *)0x17b0b0;
  puStack_4a8 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    puStack_5c0 = (uv_loop_t *)0x17b0b9;
    puVar2 = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17b0c6;
    iVar1 = uv_tcp_init(puVar2,&uStack_5a0);
    if (iVar1 != 0) goto LAB_0017b128;
    puStack_5c0 = (uv_loop_t *)0x17b0db;
    iVar1 = uv_tcp_bind(&uStack_5a0,(sockaddr *)&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_0017b12d;
    puStack_5c0 = (uv_loop_t *)0x17b0e4;
    unaff_RBX = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17b0f8;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_5c0 = (uv_loop_t *)0x17b102;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_5c0 = (uv_loop_t *)0x17b107;
    puVar2 = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17b10f;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_5c0 = (uv_loop_t *)0x17b118;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5c0 = (uv_loop_t *)0x17b128;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_0017b128:
    puStack_5c0 = (uv_loop_t *)0x17b12d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_0017b12d:
    puStack_5c0 = (uv_loop_t *)0x17b132;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_5c0 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_6d8 = (uv_loop_t *)0x17b155;
  puStack_5c0 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_6c8);
  if (iVar1 == 0) {
    puStack_6d8 = (uv_loop_t *)0x17b15e;
    puVar2 = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17b16b;
    iVar1 = uv_tcp_init(puVar2,&uStack_6b8);
    if (iVar1 != 0) goto LAB_0017b1d1;
    puStack_6d8 = (uv_loop_t *)0x17b183;
    iVar1 = uv_tcp_bind(&uStack_6b8,(sockaddr *)&sStack_6c8,1);
    if (iVar1 != -0x16) goto LAB_0017b1d6;
    puStack_6d8 = (uv_loop_t *)0x17b18d;
    unaff_RBX = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17b1a1;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_6d8 = (uv_loop_t *)0x17b1ab;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_6d8 = (uv_loop_t *)0x17b1b0;
    puVar2 = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17b1b8;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_6d8 = (uv_loop_t *)0x17b1c1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_6d8 = (uv_loop_t *)0x17b1d1;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_0017b1d1:
    puStack_6d8 = (uv_loop_t *)0x17b1d6;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_0017b1d6:
    puStack_6d8 = (uv_loop_t *)0x17b1db;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_6d8 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pvStack_7e0 = (void *)0x17b1ed;
  puStack_6d8 = unaff_RBX;
  puVar2 = uv_default_loop();
  pvStack_7e0 = (void *)0x17b1fa;
  iVar1 = uv_tcp_init(puVar2,&uStack_7d0);
  if (iVar1 == 0) {
    pvStack_7e0 = (void *)0x17b20f;
    iVar1 = uv_listen((uv_stream_t *)&uStack_7d0,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0017b25c;
    pvStack_7e0 = (void *)0x17b218;
    unaff_RBX = uv_default_loop();
    pvStack_7e0 = (void *)0x17b22c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pvStack_7e0 = (void *)0x17b236;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pvStack_7e0 = (void *)0x17b23b;
    puVar2 = uv_default_loop();
    pvStack_7e0 = (void *)0x17b243;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pvStack_7e0 = (void *)0x17b24c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pvStack_7e0 = (void *)0x17b25c;
    run_test_tcp_listen_without_bind_cold_1();
LAB_0017b25c:
    pvStack_7e0 = (void *)0x17b261;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pvStack_7e0 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  loop = "0.0.0.0";
  pvStack_7e0 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_a08);
  if (iVar1 == 0) {
    loop = (char *)uv_default_loop();
    iVar1 = uv_tcp_init((uv_loop_t *)loop,(uv_tcp_t *)auStack_9e8);
    if (iVar1 != 0) goto LAB_0017b3eb;
    loop = auStack_9e8;
    iVar1 = uv_tcp_bind((uv_tcp_t *)loop,(sockaddr *)&sStack_a08,0);
    if (iVar1 != 0) goto LAB_0017b3f0;
    loop = auStack_9e8;
    iVar1 = uv_listen((uv_stream_t *)loop,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0017b3f5;
    loop = auStack_9e8;
    iVar1 = uv_is_writable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0017b3fa;
    loop = auStack_9e8;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0017b3ff;
    uStack_9f8 = uv_buf_init("PING",4);
    loop = auStack_8a0;
    iVar1 = uv_write((uv_write_t *)loop,(uv_stream_t *)auStack_9e8,&uStack_9f8,1,(uv_write_cb)0x0);
    if (iVar1 != -0x20) goto LAB_0017b404;
    loop = auStack_9e8 + 0xf8;
    iVar1 = uv_shutdown((uv_shutdown_t *)loop,(uv_stream_t *)auStack_9e8,(uv_shutdown_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0017b409;
    loop = auStack_9e8;
    iVar1 = uv_read_start((uv_stream_t *)loop,abort,abort);
    if (iVar1 != -0x6b) goto LAB_0017b40e;
    uv_close((uv_handle_t *)auStack_9e8,close_cb);
    loop = (char *)uv_default_loop();
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017b418;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0017b3eb:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0017b3f0:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_0017b3f5:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_0017b3fa:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0017b3ff:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_0017b404:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_0017b409:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_0017b40e:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_0017b418:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_1) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.255.255.255", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  /* It seems that Linux is broken here - bind succeeds. */
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0 || r == UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}